

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

int adios2sys::SystemTools::Stat(char *path,Stat_t *buf)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  if (path == (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0xe;
    iVar1 = -1;
  }
  else {
    local_40 = local_30;
    sVar2 = strlen(path);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,path,path + sVar2);
    if (local_38 == 0) {
      piVar3 = __errno_location();
      *piVar3 = 2;
      iVar1 = -1;
    }
    else {
      iVar1 = stat(local_40,(stat *)buf);
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return iVar1;
}

Assistant:

int SystemTools::Stat(const char* path, SystemTools::Stat_t* buf)
{
  if (!path) {
    errno = EFAULT;
    return -1;
  }
  return SystemTools::Stat(std::string(path), buf);
}